

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void tf_dealloc_thread_data(AV1_COMP *cpi,int num_workers,int is_highbitdepth)

{
  TemporalFilterData *tf_data;
  int in_ESI;
  long in_RDI;
  ThreadData *td;
  EncWorkerData *thread_data;
  int i;
  MultiThreadInfo *mt_info;
  int in_stack_ffffffffffffffcc;
  undefined4 local_1c;
  
  for (local_1c = in_ESI + -1; -1 < local_1c; local_1c = local_1c + -1) {
    tf_data = *(TemporalFilterData **)(*(long *)(in_RDI + 0x9ae88) + (long)local_1c * 0x1d0 + 8);
    if (tf_data != (TemporalFilterData *)(in_RDI + 0x15030)) {
      tf_dealloc_data(tf_data,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

static void tf_dealloc_thread_data(AV1_COMP *cpi, int num_workers,
                                   int is_highbitdepth) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) tf_dealloc_data(&td->tf_data, is_highbitdepth);
  }
}